

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall
wabt::WastParser::ParsePlainInstr
          (WastParser *this,unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *out_expr)

{
  Location loc_00;
  Location loc_01;
  Location loc_02;
  Location loc_03;
  Location loc_04;
  Location loc_05;
  Location loc_06;
  Location loc_07;
  Location loc_08;
  Location loc_09;
  Location loc_10;
  Location loc_11;
  Location loc_12;
  Location loc_13;
  Location loc_14;
  Location loc_15;
  Location loc_16;
  Location loc_17;
  Location loc_18;
  Location loc_19;
  Location loc_20;
  Location loc_21;
  TokenType TVar1;
  Opcode OVar2;
  Result RVar3;
  Enum EVar4;
  Expr *pEVar5;
  undefined *puVar6;
  Token *pTVar7;
  undefined1 auVar8 [8];
  Expr *pEVar9;
  Token local_9a0;
  Token local_950;
  Token local_900;
  Token local_8b0;
  Token local_860;
  Token local_810;
  Token local_7c0;
  Token local_770;
  Token local_720;
  Token local_6d0;
  Token local_680;
  Token local_630;
  Token local_5e0;
  Token local_590;
  Token local_540;
  Token local_4f0;
  Token local_4a0;
  Token local_450;
  Token local_400;
  Token local_3b0;
  Token local_360;
  Token local_310;
  Token local_2c0;
  Token local_270;
  Token local_220;
  _func_int **local_1d0;
  uint64_t lane_idx;
  undefined4 local_1a8;
  undefined4 uStack_1a4;
  undefined4 uStack_1a0;
  undefined4 uStack_19c;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined1 auStack_90 [8];
  Token token;
  Location loc;
  
  GetLocation((Location *)((long)&token.field_2.literal_.text.field_2 + 8),this);
  TVar1 = Peek(this,0);
  switch(TVar1) {
  case AtomicLoad:
    Consume((Token *)auStack_90,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)auStack_90);
    local_118 = CONCAT44(token.field_2._36_4_,token.field_2._32_4_);
    uStack_110 = CONCAT44(loc.filename.data_._4_4_,loc.filename.data_._0_4_);
    local_108 = CONCAT44(loc.filename.size_._4_4_,(int)loc.filename.size_);
    uStack_100 = CONCAT44(loc.field_1.field_0.first_column,loc.field_1.field_0.line);
    Token::Token(&local_310,(Token *)auStack_90);
    loc_00.filename.size_ = uStack_110;
    loc_00.filename.data_ = (char *)local_118;
    loc_00.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)local_108;
    loc_00.field_1._8_8_ = uStack_100;
    RVar3 = ParsePlainLoadStoreInstr<wabt::LoadStoreExpr<(wabt::ExprType)0>>
                      (this,loc_00,&local_310,out_expr);
    pTVar7 = &local_310;
    goto LAB_00daa393;
  case AtomicRmw:
    Consume((Token *)auStack_90,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)auStack_90);
    local_d8 = CONCAT44(token.field_2._36_4_,token.field_2._32_4_);
    uStack_d0 = CONCAT44(loc.filename.data_._4_4_,loc.filename.data_._0_4_);
    local_c8 = CONCAT44(loc.filename.size_._4_4_,(int)loc.filename.size_);
    uStack_c0 = CONCAT44(loc.field_1.field_0.first_column,loc.field_1.field_0.line);
    Token::Token(&local_270,(Token *)auStack_90);
    loc_12.filename.size_ = uStack_d0;
    loc_12.filename.data_ = (char *)local_d8;
    loc_12.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)local_c8;
    loc_12.field_1._8_8_ = uStack_c0;
    RVar3 = ParsePlainLoadStoreInstr<wabt::LoadStoreExpr<(wabt::ExprType)1>>
                      (this,loc_12,&local_270,out_expr);
    pTVar7 = &local_270;
    goto LAB_00daa393;
  case AtomicRmwCmpxchg:
    Consume((Token *)auStack_90,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)auStack_90);
    local_b8 = CONCAT44(token.field_2._36_4_,token.field_2._32_4_);
    uStack_b0 = CONCAT44(loc.filename.data_._4_4_,loc.filename.data_._0_4_);
    local_a8 = CONCAT44(loc.filename.size_._4_4_,(int)loc.filename.size_);
    uStack_a0 = CONCAT44(loc.field_1.field_0.first_column,loc.field_1.field_0.line);
    Token::Token(&local_220,(Token *)auStack_90);
    loc_16.filename.size_ = uStack_b0;
    loc_16.filename.data_ = (char *)local_b8;
    loc_16.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)local_a8;
    loc_16.field_1._8_8_ = uStack_a0;
    RVar3 = ParsePlainLoadStoreInstr<wabt::LoadStoreExpr<(wabt::ExprType)2>>
                      (this,loc_16,&local_220,out_expr);
    pTVar7 = &local_220;
    goto LAB_00daa393;
  case AtomicStore:
    Consume((Token *)auStack_90,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)auStack_90);
    local_f8 = CONCAT44(token.field_2._36_4_,token.field_2._32_4_);
    uStack_f0 = CONCAT44(loc.filename.data_._4_4_,loc.filename.data_._0_4_);
    local_e8 = CONCAT44(loc.filename.size_._4_4_,(int)loc.filename.size_);
    uStack_e0 = CONCAT44(loc.field_1.field_0.first_column,loc.field_1.field_0.line);
    Token::Token(&local_2c0,(Token *)auStack_90);
    loc_10.filename.size_ = uStack_f0;
    loc_10.filename.data_ = (char *)local_f8;
    loc_10.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)local_e8;
    loc_10.field_1._8_8_ = uStack_e0;
    RVar3 = ParsePlainLoadStoreInstr<wabt::LoadStoreExpr<(wabt::ExprType)3>>
                      (this,loc_10,&local_2c0,out_expr);
    pTVar7 = &local_2c0;
    goto LAB_00daa393;
  case AtomicWait:
    Consume((Token *)auStack_90,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)auStack_90);
    local_138 = CONCAT44(token.field_2._36_4_,token.field_2._32_4_);
    uStack_130 = CONCAT44(loc.filename.data_._4_4_,loc.filename.data_._0_4_);
    local_128 = CONCAT44(loc.filename.size_._4_4_,(int)loc.filename.size_);
    uStack_120 = CONCAT44(loc.field_1.field_0.first_column,loc.field_1.field_0.line);
    Token::Token(&local_360,(Token *)auStack_90);
    loc_15.filename.size_ = uStack_130;
    loc_15.filename.data_ = (char *)local_138;
    loc_15.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)local_128;
    loc_15.field_1._8_8_ = uStack_120;
    RVar3 = ParsePlainLoadStoreInstr<wabt::LoadStoreExpr<(wabt::ExprType)4>>
                      (this,loc_15,&local_360,out_expr);
    pTVar7 = &local_360;
    goto LAB_00daa393;
  case AtomicWake:
    Consume((Token *)auStack_90,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)auStack_90);
    local_158 = CONCAT44(token.field_2._36_4_,token.field_2._32_4_);
    uStack_150 = CONCAT44(loc.filename.data_._4_4_,loc.filename.data_._0_4_);
    local_148 = CONCAT44(loc.filename.size_._4_4_,(int)loc.filename.size_);
    uStack_140 = CONCAT44(loc.field_1.field_0.first_column,loc.field_1.field_0.line);
    Token::Token(&local_3b0,(Token *)auStack_90);
    loc_18.filename.size_ = uStack_150;
    loc_18.filename.data_ = (char *)local_158;
    loc_18.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)local_148;
    loc_18.field_1._8_8_ = uStack_140;
    RVar3 = ParsePlainLoadStoreInstr<wabt::LoadStoreExpr<(wabt::ExprType)5>>
                      (this,loc_18,&local_3b0,out_expr);
    pTVar7 = &local_3b0;
LAB_00daa393:
    Token::~Token(pTVar7);
    pTVar7 = (Token *)auStack_90;
LAB_00daa39f:
    Token::~Token(pTVar7);
    break;
  case Binary:
    pEVar5 = (Expr *)operator_new(0x40);
    Consume((Token *)auStack_90,this);
    OVar2 = Token::opcode((Token *)auStack_90);
    (pEVar5->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar5->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    *(undefined4 *)&(pEVar5->loc).filename.data_ = token.field_2._32_4_;
    *(undefined4 *)((long)&(pEVar5->loc).filename.data_ + 4) = token.field_2._36_4_;
    *(undefined4 *)&(pEVar5->loc).filename.size_ = loc.filename.data_._0_4_;
    *(undefined4 *)((long)&(pEVar5->loc).filename.size_ + 4) = loc.filename.data_._4_4_;
    (pEVar5->loc).field_1.field_0.line = (int)loc.filename.size_;
    (pEVar5->loc).field_1.field_0.first_column = loc.filename.size_._4_4_;
    (pEVar5->loc).field_1.field_0.last_column = loc.field_1.field_0.line;
    *(int *)((long)&(pEVar5->loc).field_1 + 0xc) = loc.field_1.field_0.first_column;
    pEVar5->type_ = Binary;
    puVar6 = &OpcodeExpr<(wabt::ExprType)6>::vtable;
    goto LAB_00da9d71;
  default:
    __assert_fail("!\"ParsePlainInstr should only be called when IsPlainInstr() is true\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/wast-parser.cc"
                  ,0x648,"Result wabt::WastParser::ParsePlainInstr(std::unique_ptr<Expr> *)");
  case Br:
    Consume(&local_860,this);
    Token::~Token(&local_860);
    loc_17.filename.data_._4_4_ = token.field_2._36_4_;
    loc_17.filename.data_._0_4_ = token.field_2._32_4_;
    loc_17.filename.size_._4_4_ = loc.filename.data_._4_4_;
    loc_17.filename.size_._0_4_ = loc.filename.data_._0_4_;
    loc_17.field_1.field_0.first_column = loc.filename.size_._4_4_;
    loc_17.field_1.field_0.line = (int)loc.filename.size_;
    loc_17.field_1._12_4_ = loc.field_1.field_0.first_column;
    loc_17.field_1.field_0.last_column = loc.field_1.field_0.line;
    RVar3 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)8>>(this,loc_17,out_expr);
    break;
  case BrIf:
    Consume(&local_810,this);
    Token::~Token(&local_810);
    loc_08.filename.data_._4_4_ = token.field_2._36_4_;
    loc_08.filename.data_._0_4_ = token.field_2._32_4_;
    loc_08.filename.size_._4_4_ = loc.filename.data_._4_4_;
    loc_08.filename.size_._0_4_ = loc.filename.data_._0_4_;
    loc_08.field_1.field_0.first_column = loc.filename.size_._4_4_;
    loc_08.field_1.field_0.line = (int)loc.filename.size_;
    loc_08.field_1._12_4_ = loc.field_1.field_0.first_column;
    loc_08.field_1.field_0.last_column = loc.field_1.field_0.line;
    RVar3 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)9>>(this,loc_08,out_expr);
    break;
  case BrTable:
    Consume(&local_7c0,this);
    Token::~Token(&local_7c0);
    MakeUnique<wabt::BrTableExpr,wabt::Location&>
              ((wabt *)auStack_90,(Location *)((long)&token.field_2.literal_.text.field_2 + 8));
    RVar3 = ParseVarList(this,(VarVector *)((long)auStack_90 + 0x40));
    if (RVar3.enum_ == Error) {
LAB_00da9bcb:
      if (auStack_90 != (undefined1  [8])0x0) {
        (*(*(_func_int ***)auStack_90)[1])();
      }
      if (RVar3.enum_ == Error) goto LAB_00daa75f;
    }
    else {
      Var::operator=((Var *)&((Expr *)((long)auStack_90 + 0x40))->loc,
                     (Var *)&(((Expr *)((long)auStack_90 + 0x40))->
                             super_intrusive_list_base<wabt::Expr>).next_[-2].type_);
      std::vector<wabt::Var,_std::allocator<wabt::Var>_>::pop_back
                ((vector<wabt::Var,_std::allocator<wabt::Var>_> *)((long)auStack_90 + 0x40));
      auVar8 = auStack_90;
      auStack_90 = (undefined1  [8])0x0;
      pEVar5 = (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>.
               _M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
               super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl;
      (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
      super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
      super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl = (Expr *)auVar8;
      if (pEVar5 != (Expr *)0x0) {
        (*pEVar5->_vptr_Expr[1])();
        goto LAB_00da9bcb;
      }
    }
    goto LAB_00daa790;
  case Call:
    Consume(&local_720,this);
    Token::~Token(&local_720);
    loc_07.filename.data_._4_4_ = token.field_2._36_4_;
    loc_07.filename.data_._0_4_ = token.field_2._32_4_;
    loc_07.filename.size_._4_4_ = loc.filename.data_._4_4_;
    loc_07.filename.size_._0_4_ = loc.filename.data_._0_4_;
    loc_07.field_1.field_0.first_column = loc.filename.size_._4_4_;
    loc_07.field_1.field_0.line = (int)loc.filename.size_;
    loc_07.field_1._12_4_ = loc.field_1.field_0.first_column;
    loc_07.field_1.field_0.last_column = loc.field_1.field_0.line;
    RVar3 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)11>>(this,loc_07,out_expr);
    break;
  case CallIndirect:
    Consume(&local_6d0,this);
    Token::~Token(&local_6d0);
    MakeUnique<wabt::CallIndirectExpr,wabt::Location&>
              ((wabt *)auStack_90,(Location *)((long)&token.field_2.literal_.text.field_2 + 8));
    RVar3 = ParseTypeUseOpt(this,(FuncDeclaration *)((long)auStack_90 + 0x40));
    if (RVar3.enum_ == Error) goto LAB_00daa4bf;
    RVar3 = ParseUnboundFuncSignature
                      (this,(FuncSignature *)
                            &(((Expr *)((long)auStack_90 + 0x80))->
                             super_intrusive_list_base<wabt::Expr>).prev_);
LAB_00daa4b6:
    auVar8 = auStack_90;
    if (RVar3.enum_ == Error) goto LAB_00daa4bf;
    auStack_90 = (undefined1  [8])0x0;
    pEVar5 = (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>.
             _M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
             super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl;
    (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
    super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
    super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl = (Expr *)auVar8;
    if (pEVar5 == (Expr *)0x0) goto LAB_00daa790;
    (*pEVar5->_vptr_Expr[1])();
    auVar8 = auStack_90;
    goto LAB_00daa67a;
  case Compare:
    pEVar5 = (Expr *)operator_new(0x40);
    Consume((Token *)auStack_90,this);
    OVar2 = Token::opcode((Token *)auStack_90);
    (pEVar5->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar5->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    *(undefined4 *)&(pEVar5->loc).filename.data_ = token.field_2._32_4_;
    *(undefined4 *)((long)&(pEVar5->loc).filename.data_ + 4) = token.field_2._36_4_;
    *(undefined4 *)&(pEVar5->loc).filename.size_ = loc.filename.data_._0_4_;
    *(undefined4 *)((long)&(pEVar5->loc).filename.size_ + 4) = loc.filename.data_._4_4_;
    (pEVar5->loc).field_1.field_0.line = (int)loc.filename.size_;
    (pEVar5->loc).field_1.field_0.first_column = loc.filename.size_._4_4_;
    (pEVar5->loc).field_1.field_0.last_column = loc.field_1.field_0.line;
    *(int *)((long)&(pEVar5->loc).field_1 + 0xc) = loc.field_1.field_0.first_column;
    pEVar5->type_ = Compare;
    puVar6 = &OpcodeExpr<(wabt::ExprType)13>::vtable;
LAB_00da9d71:
    pEVar5->_vptr_Expr = (_func_int **)(puVar6 + 0x10);
    *(Enum *)&pEVar5->field_0x3c = OVar2.enum_;
    pEVar9 = (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>.
             _M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
             super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl;
    (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
    super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
    super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl = pEVar5;
    goto LAB_00daa6fc;
  case Const:
    Const::Const((Const *)auStack_90);
    RVar3 = ParseConst(this,(Const *)auStack_90);
    if (RVar3.enum_ == Error) goto LAB_00daa75f;
    pEVar5 = (Expr *)operator_new(0x78);
    (pEVar5->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar5->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    (pEVar5->loc).filename.data_ = (char *)CONCAT44(token.field_2._36_4_,token.field_2._32_4_);
    (pEVar5->loc).filename.size_ = CONCAT44(loc.filename.data_._4_4_,loc.filename.data_._0_4_);
    (pEVar5->loc).field_1.field_1.offset =
         CONCAT44(loc.filename.size_._4_4_,(int)loc.filename.size_);
    *(ulong *)((long)&(pEVar5->loc).field_1 + 8) =
         CONCAT44(loc.field_1.field_0.first_column,loc.field_1.field_0.line);
    pEVar5->type_ = Const;
    pEVar5->_vptr_Expr = (_func_int **)&PTR__Expr_013e1e48;
    pEVar5[1]._vptr_Expr = (_func_int **)auStack_90;
    pEVar5[1].super_intrusive_list_base<wabt::Expr>.next_ = (Expr *)token.loc.filename.data_;
    pEVar5[1].super_intrusive_list_base<wabt::Expr>.prev_ = (Expr *)token.loc.filename.size_;
    pEVar5[1].loc.filename.data_ = (char *)token.loc.field_1.field_1.offset;
    pEVar5[1].loc.filename.size_ = token.loc.field_1._8_8_;
    pEVar5[1].loc.field_1.field_1.offset = token._32_8_;
    ((_Alloc_hider *)((long)&pEVar5[1].loc.field_1 + 8))->_M_p =
         (pointer)token.field_2.text_._M_dataplus._M_p;
    goto LAB_00daa674;
  case Convert:
    Consume((Token *)auStack_90,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)auStack_90);
    pEVar5 = (Expr *)operator_new(0x40);
    OVar2 = Token::opcode((Token *)auStack_90);
    (pEVar5->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar5->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    *(undefined4 *)&(pEVar5->loc).filename.data_ = token.field_2._32_4_;
    *(undefined4 *)((long)&(pEVar5->loc).filename.data_ + 4) = token.field_2._36_4_;
    *(undefined4 *)&(pEVar5->loc).filename.size_ = loc.filename.data_._0_4_;
    *(undefined4 *)((long)&(pEVar5->loc).filename.size_ + 4) = loc.filename.data_._4_4_;
    (pEVar5->loc).field_1.field_0.line = (int)loc.filename.size_;
    (pEVar5->loc).field_1.field_0.first_column = loc.filename.size_._4_4_;
    (pEVar5->loc).field_1.field_0.last_column = loc.field_1.field_0.line;
    *(int *)((long)&(pEVar5->loc).field_1 + 0xc) = loc.field_1.field_0.first_column;
    pEVar5->type_ = Convert;
    puVar6 = &OpcodeExpr<(wabt::ExprType)15>::vtable;
    goto LAB_00daa6eb;
  case Drop:
    Consume(&local_900,this);
    Token::~Token(&local_900);
    pEVar5 = (Expr *)operator_new(0x40);
    (pEVar5->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar5->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    (pEVar5->loc).filename.data_ = (char *)CONCAT44(token.field_2._36_4_,token.field_2._32_4_);
    (pEVar5->loc).filename.size_ = CONCAT44(loc.filename.data_._4_4_,loc.filename.data_._0_4_);
    (pEVar5->loc).field_1.field_1.offset =
         CONCAT44(loc.filename.size_._4_4_,(int)loc.filename.size_);
    *(ulong *)((long)&(pEVar5->loc).field_1 + 8) =
         CONCAT44(loc.field_1.field_0.first_column,loc.field_1.field_0.line);
    pEVar5->type_ = Drop;
    puVar6 = &ExprMixin<(wabt::ExprType)16>::vtable;
    goto LAB_00daa66d;
  case GetGlobal:
    Consume(&local_590,this);
    Token::~Token(&local_590);
    loc_11.filename.data_._4_4_ = token.field_2._36_4_;
    loc_11.filename.data_._0_4_ = token.field_2._32_4_;
    loc_11.filename.size_._4_4_ = loc.filename.data_._4_4_;
    loc_11.filename.size_._0_4_ = loc.filename.data_._0_4_;
    loc_11.field_1.field_0.first_column = loc.filename.size_._4_4_;
    loc_11.field_1.field_0.line = (int)loc.filename.size_;
    loc_11.field_1._12_4_ = loc.field_1.field_0.first_column;
    loc_11.field_1.field_0.last_column = loc.field_1.field_0.line;
    RVar3 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)17>>(this,loc_11,out_expr);
    break;
  case GetLocal:
    Consume(&local_680,this);
    Token::~Token(&local_680);
    loc_09.filename.data_._4_4_ = token.field_2._36_4_;
    loc_09.filename.data_._0_4_ = token.field_2._32_4_;
    loc_09.filename.size_._4_4_ = loc.filename.data_._4_4_;
    loc_09.filename.size_._0_4_ = loc.filename.data_._0_4_;
    loc_09.field_1.field_0.first_column = loc.filename.size_._4_4_;
    loc_09.field_1.field_0.line = (int)loc.filename.size_;
    loc_09.field_1._12_4_ = loc.field_1.field_0.first_column;
    loc_09.field_1.field_0.last_column = loc.field_1.field_0.line;
    RVar3 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)18>>(this,loc_09,out_expr);
    break;
  case Load:
    local_198 = CONCAT44(token.field_2._36_4_,token.field_2._32_4_);
    uStack_190 = CONCAT44(loc.filename.data_._4_4_,loc.filename.data_._0_4_);
    local_188 = CONCAT44(loc.filename.size_._4_4_,(int)loc.filename.size_);
    uStack_180 = CONCAT44(loc.field_1.field_0.first_column,loc.field_1.field_0.line);
    Consume(&local_450,this);
    loc_19.filename.size_ = uStack_190;
    loc_19.filename.data_ = (char *)local_198;
    loc_19.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)local_188;
    loc_19.field_1._8_8_ = uStack_180;
    RVar3 = ParsePlainLoadStoreInstr<wabt::LoadStoreExpr<(wabt::ExprType)21>>
                      (this,loc_19,&local_450,out_expr);
    pTVar7 = &local_450;
    goto LAB_00daa39f;
  case MemoryCopy:
    Consume((Token *)auStack_90,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)auStack_90);
    Token::~Token((Token *)auStack_90);
    pEVar5 = (Expr *)operator_new(0x40);
    (pEVar5->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar5->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    (pEVar5->loc).filename.data_ = (char *)CONCAT44(token.field_2._36_4_,token.field_2._32_4_);
    (pEVar5->loc).filename.size_ = CONCAT44(loc.filename.data_._4_4_,loc.filename.data_._0_4_);
    (pEVar5->loc).field_1.field_1.offset =
         CONCAT44(loc.filename.size_._4_4_,(int)loc.filename.size_);
    *(ulong *)((long)&(pEVar5->loc).field_1 + 8) =
         CONCAT44(loc.field_1.field_0.first_column,loc.field_1.field_0.line);
    pEVar5->type_ = MemoryCopy;
    puVar6 = &ExprMixin<(wabt::ExprType)23>::vtable;
    goto LAB_00daa66d;
  case MemoryDrop:
    Consume((Token *)auStack_90,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)auStack_90);
    Token::~Token((Token *)auStack_90);
    loc_06.filename.data_._4_4_ = token.field_2._36_4_;
    loc_06.filename.data_._0_4_ = token.field_2._32_4_;
    loc_06.filename.size_._4_4_ = loc.filename.data_._4_4_;
    loc_06.filename.size_._0_4_ = loc.filename.data_._0_4_;
    loc_06.field_1.field_0.first_column = loc.filename.size_._4_4_;
    loc_06.field_1.field_0.line = (int)loc.filename.size_;
    loc_06.field_1._12_4_ = loc.field_1.field_0.first_column;
    loc_06.field_1.field_0.last_column = loc.field_1.field_0.line;
    RVar3 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)24>>(this,loc_06,out_expr);
    break;
  case MemoryFill:
    Consume((Token *)auStack_90,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)auStack_90);
    Token::~Token((Token *)auStack_90);
    pEVar5 = (Expr *)operator_new(0x40);
    (pEVar5->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar5->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    (pEVar5->loc).filename.data_ = (char *)CONCAT44(token.field_2._36_4_,token.field_2._32_4_);
    (pEVar5->loc).filename.size_ = CONCAT44(loc.filename.data_._4_4_,loc.filename.data_._0_4_);
    (pEVar5->loc).field_1.field_1.offset =
         CONCAT44(loc.filename.size_._4_4_,(int)loc.filename.size_);
    *(ulong *)((long)&(pEVar5->loc).field_1 + 8) =
         CONCAT44(loc.field_1.field_0.first_column,loc.field_1.field_0.line);
    pEVar5->type_ = MemoryFill;
    puVar6 = &ExprMixin<(wabt::ExprType)25>::vtable;
    goto LAB_00daa66d;
  case MemoryGrow:
    Consume(&local_4a0,this);
    Token::~Token(&local_4a0);
    pEVar5 = (Expr *)operator_new(0x40);
    (pEVar5->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar5->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    (pEVar5->loc).filename.data_ = (char *)CONCAT44(token.field_2._36_4_,token.field_2._32_4_);
    (pEVar5->loc).filename.size_ = CONCAT44(loc.filename.data_._4_4_,loc.filename.data_._0_4_);
    (pEVar5->loc).field_1.field_1.offset =
         CONCAT44(loc.filename.size_._4_4_,(int)loc.filename.size_);
    *(ulong *)((long)&(pEVar5->loc).field_1 + 8) =
         CONCAT44(loc.field_1.field_0.first_column,loc.field_1.field_0.line);
    pEVar5->type_ = MemoryGrow;
    puVar6 = &ExprMixin<(wabt::ExprType)26>::vtable;
    goto LAB_00daa66d;
  case MemoryInit:
    Consume((Token *)auStack_90,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)auStack_90);
    Token::~Token((Token *)auStack_90);
    loc_03.filename.data_._4_4_ = token.field_2._36_4_;
    loc_03.filename.data_._0_4_ = token.field_2._32_4_;
    loc_03.filename.size_._4_4_ = loc.filename.data_._4_4_;
    loc_03.filename.size_._0_4_ = loc.filename.data_._0_4_;
    loc_03.field_1.field_0.first_column = loc.filename.size_._4_4_;
    loc_03.field_1.field_0.line = (int)loc.filename.size_;
    loc_03.field_1._12_4_ = loc.field_1.field_0.first_column;
    loc_03.field_1.field_0.last_column = loc.field_1.field_0.line;
    RVar3 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)27>>(this,loc_03,out_expr);
    break;
  case MemorySize:
    Consume(&local_4f0,this);
    Token::~Token(&local_4f0);
    pEVar5 = (Expr *)operator_new(0x40);
    (pEVar5->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar5->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    (pEVar5->loc).filename.data_ = (char *)CONCAT44(token.field_2._36_4_,token.field_2._32_4_);
    (pEVar5->loc).filename.size_ = CONCAT44(loc.filename.data_._4_4_,loc.filename.data_._0_4_);
    (pEVar5->loc).field_1.field_1.offset =
         CONCAT44(loc.filename.size_._4_4_,(int)loc.filename.size_);
    *(ulong *)((long)&(pEVar5->loc).field_1 + 8) =
         CONCAT44(loc.field_1.field_0.first_column,loc.field_1.field_0.line);
    pEVar5->type_ = MemorySize;
    puVar6 = &ExprMixin<(wabt::ExprType)28>::vtable;
    goto LAB_00daa66d;
  case TableCopy:
    Consume((Token *)auStack_90,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)auStack_90);
    Token::~Token((Token *)auStack_90);
    pEVar5 = (Expr *)operator_new(0x40);
    (pEVar5->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar5->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    (pEVar5->loc).filename.data_ = (char *)CONCAT44(token.field_2._36_4_,token.field_2._32_4_);
    (pEVar5->loc).filename.size_ = CONCAT44(loc.filename.data_._4_4_,loc.filename.data_._0_4_);
    (pEVar5->loc).field_1.field_1.offset =
         CONCAT44(loc.filename.size_._4_4_,(int)loc.filename.size_);
    *(ulong *)((long)&(pEVar5->loc).field_1 + 8) =
         CONCAT44(loc.field_1.field_0.first_column,loc.field_1.field_0.line);
    pEVar5->type_ = TableCopy;
    puVar6 = &ExprMixin<(wabt::ExprType)41>::vtable;
    goto LAB_00daa66d;
  case TableDrop:
    Consume((Token *)auStack_90,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)auStack_90);
    Token::~Token((Token *)auStack_90);
    loc_13.filename.data_._4_4_ = token.field_2._36_4_;
    loc_13.filename.data_._0_4_ = token.field_2._32_4_;
    loc_13.filename.size_._4_4_ = loc.filename.data_._4_4_;
    loc_13.filename.size_._0_4_ = loc.filename.data_._0_4_;
    loc_13.field_1.field_0.first_column = loc.filename.size_._4_4_;
    loc_13.field_1.field_0.line = (int)loc.filename.size_;
    loc_13.field_1._12_4_ = loc.field_1.field_0.first_column;
    loc_13.field_1.field_0.last_column = loc.field_1.field_0.line;
    RVar3 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)42>>(this,loc_13,out_expr);
    break;
  case TableInit:
    Consume((Token *)auStack_90,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)auStack_90);
    Token::~Token((Token *)auStack_90);
    loc_20.filename.data_._4_4_ = token.field_2._36_4_;
    loc_20.filename.data_._0_4_ = token.field_2._32_4_;
    loc_20.filename.size_._4_4_ = loc.filename.data_._4_4_;
    loc_20.filename.size_._0_4_ = loc.filename.data_._0_4_;
    loc_20.field_1.field_0.first_column = loc.filename.size_._4_4_;
    loc_20.field_1.field_0.line = (int)loc.filename.size_;
    loc_20.field_1._12_4_ = loc.field_1.field_0.first_column;
    loc_20.field_1.field_0.last_column = loc.field_1.field_0.line;
    RVar3 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)40>>(this,loc_20,out_expr);
    break;
  case Nop:
    Consume(&local_950,this);
    Token::~Token(&local_950);
    pEVar5 = (Expr *)operator_new(0x40);
    (pEVar5->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar5->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    (pEVar5->loc).filename.data_ = (char *)CONCAT44(token.field_2._36_4_,token.field_2._32_4_);
    (pEVar5->loc).filename.size_ = CONCAT44(loc.filename.data_._4_4_,loc.filename.data_._0_4_);
    (pEVar5->loc).field_1.field_1.offset =
         CONCAT44(loc.filename.size_._4_4_,(int)loc.filename.size_);
    *(ulong *)((long)&(pEVar5->loc).field_1 + 8) =
         CONCAT44(loc.field_1.field_0.first_column,loc.field_1.field_0.line);
    pEVar5->type_ = Nop;
    puVar6 = &ExprMixin<(wabt::ExprType)29>::vtable;
    goto LAB_00daa66d;
  case Rethrow:
    Consume((Token *)auStack_90,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)auStack_90);
    Token::~Token((Token *)auStack_90);
    pEVar5 = (Expr *)operator_new(0x40);
    (pEVar5->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar5->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    (pEVar5->loc).filename.data_ = (char *)CONCAT44(token.field_2._36_4_,token.field_2._32_4_);
    (pEVar5->loc).filename.size_ = CONCAT44(loc.filename.data_._4_4_,loc.filename.data_._0_4_);
    (pEVar5->loc).field_1.field_1.offset =
         CONCAT44(loc.filename.size_._4_4_,(int)loc.filename.size_);
    *(ulong *)((long)&(pEVar5->loc).field_1 + 8) =
         CONCAT44(loc.field_1.field_0.first_column,loc.field_1.field_0.line);
    pEVar5->type_ = Rethrow;
    puVar6 = &ExprMixin<(wabt::ExprType)30>::vtable;
    goto LAB_00daa66d;
  case Return:
    Consume(&local_770,this);
    Token::~Token(&local_770);
    pEVar5 = (Expr *)operator_new(0x40);
    (pEVar5->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar5->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    (pEVar5->loc).filename.data_ = (char *)CONCAT44(token.field_2._36_4_,token.field_2._32_4_);
    (pEVar5->loc).filename.size_ = CONCAT44(loc.filename.data_._4_4_,loc.filename.data_._0_4_);
    (pEVar5->loc).field_1.field_1.offset =
         CONCAT44(loc.filename.size_._4_4_,(int)loc.filename.size_);
    *(ulong *)((long)&(pEVar5->loc).field_1 + 8) =
         CONCAT44(loc.field_1.field_0.first_column,loc.field_1.field_0.line);
    pEVar5->type_ = Return;
    puVar6 = &ExprMixin<(wabt::ExprType)31>::vtable;
    goto LAB_00daa66d;
  case ReturnCall:
    Consume((Token *)auStack_90,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)auStack_90);
    Token::~Token((Token *)auStack_90);
    loc_14.filename.data_._4_4_ = token.field_2._36_4_;
    loc_14.filename.data_._0_4_ = token.field_2._32_4_;
    loc_14.filename.size_._4_4_ = loc.filename.data_._4_4_;
    loc_14.filename.size_._0_4_ = loc.filename.data_._0_4_;
    loc_14.field_1.field_0.first_column = loc.filename.size_._4_4_;
    loc_14.field_1.field_0.line = (int)loc.filename.size_;
    loc_14.field_1._12_4_ = loc.field_1.field_0.first_column;
    loc_14.field_1.field_0.last_column = loc.field_1.field_0.line;
    RVar3 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)32>>(this,loc_14,out_expr);
    break;
  case ReturnCallIndirect:
    Consume((Token *)auStack_90,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)auStack_90);
    Token::~Token((Token *)auStack_90);
    MakeUnique<wabt::ReturnCallIndirectExpr,wabt::Location&>
              ((wabt *)auStack_90,(Location *)((long)&token.field_2.literal_.text.field_2 + 8));
    RVar3 = ParseTypeUseOpt(this,(FuncDeclaration *)((long)auStack_90 + 0x40));
    if (RVar3.enum_ != Error) {
      RVar3 = ParseUnboundFuncSignature
                        (this,(FuncSignature *)
                              &(((Expr *)((long)auStack_90 + 0x80))->
                               super_intrusive_list_base<wabt::Expr>).prev_);
      goto LAB_00daa4b6;
    }
LAB_00daa4bf:
    if (auStack_90 != (undefined1  [8])0x0) {
      (*(*(_func_int ***)auStack_90)[1])();
    }
    goto LAB_00daa75f;
  case Select:
    Consume(&local_8b0,this);
    Token::~Token(&local_8b0);
    pEVar5 = (Expr *)operator_new(0x40);
    (pEVar5->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar5->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    (pEVar5->loc).filename.data_ = (char *)CONCAT44(token.field_2._36_4_,token.field_2._32_4_);
    (pEVar5->loc).filename.size_ = CONCAT44(loc.filename.data_._4_4_,loc.filename.data_._0_4_);
    (pEVar5->loc).field_1.field_1.offset =
         CONCAT44(loc.filename.size_._4_4_,(int)loc.filename.size_);
    *(ulong *)((long)&(pEVar5->loc).field_1 + 8) =
         CONCAT44(loc.field_1.field_0.first_column,loc.field_1.field_0.line);
    pEVar5->type_ = Select;
    puVar6 = &ExprMixin<(wabt::ExprType)34>::vtable;
    goto LAB_00daa66d;
  case SetGlobal:
    Consume(&local_540,this);
    Token::~Token(&local_540);
    loc_05.filename.data_._4_4_ = token.field_2._36_4_;
    loc_05.filename.data_._0_4_ = token.field_2._32_4_;
    loc_05.filename.size_._4_4_ = loc.filename.data_._4_4_;
    loc_05.filename.size_._0_4_ = loc.filename.data_._0_4_;
    loc_05.field_1.field_0.first_column = loc.filename.size_._4_4_;
    loc_05.field_1.field_0.line = (int)loc.filename.size_;
    loc_05.field_1._12_4_ = loc.field_1.field_0.first_column;
    loc_05.field_1.field_0.last_column = loc.field_1.field_0.line;
    RVar3 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)35>>(this,loc_05,out_expr);
    break;
  case SetLocal:
    Consume(&local_630,this);
    Token::~Token(&local_630);
    loc_04.filename.data_._4_4_ = token.field_2._36_4_;
    loc_04.filename.data_._0_4_ = token.field_2._32_4_;
    loc_04.filename.size_._4_4_ = loc.filename.data_._4_4_;
    loc_04.filename.size_._0_4_ = loc.filename.data_._0_4_;
    loc_04.field_1.field_0.first_column = loc.filename.size_._4_4_;
    loc_04.field_1.field_0.line = (int)loc.filename.size_;
    loc_04.field_1._12_4_ = loc.field_1.field_0.first_column;
    loc_04.field_1.field_0.last_column = loc.field_1.field_0.line;
    RVar3 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)36>>(this,loc_04,out_expr);
    break;
  case SimdLaneOp:
    Consume((Token *)auStack_90,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)auStack_90);
    RVar3 = ParseNat(this,(uint64_t *)&stack0xfffffffffffffe30);
    if (RVar3.enum_ == Error) {
LAB_00da9b2a:
      Token::~Token((Token *)auStack_90);
      goto LAB_00daa75f;
    }
    pEVar5 = (Expr *)operator_new(0x48);
    OVar2 = Token::opcode((Token *)auStack_90);
    (pEVar5->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar5->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    *(undefined4 *)&(pEVar5->loc).filename.data_ = token.field_2._32_4_;
    *(undefined4 *)((long)&(pEVar5->loc).filename.data_ + 4) = token.field_2._36_4_;
    *(undefined4 *)&(pEVar5->loc).filename.size_ = loc.filename.data_._0_4_;
    *(undefined4 *)((long)&(pEVar5->loc).filename.size_ + 4) = loc.filename.data_._4_4_;
    (pEVar5->loc).field_1.field_0.line = (int)loc.filename.size_;
    (pEVar5->loc).field_1.field_0.first_column = loc.filename.size_._4_4_;
    (pEVar5->loc).field_1.field_0.last_column = loc.field_1.field_0.line;
    *(int *)((long)&(pEVar5->loc).field_1 + 0xc) = loc.field_1.field_0.first_column;
    pEVar5->type_ = SimdLaneOp;
    pEVar5->_vptr_Expr = (_func_int **)&PTR__Expr_013e2708;
    *(Enum *)&pEVar5->field_0x3c = OVar2.enum_;
    pEVar5[1]._vptr_Expr = local_1d0;
    goto LAB_00daa6f6;
  case SimdShuffleOp:
    Consume((Token *)auStack_90,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)auStack_90);
    Const::Const((Const *)&stack0xfffffffffffffe30);
    RVar3 = ParseSimdConst(this,(Const *)&stack0xfffffffffffffe30,I32,0x10);
    if (RVar3.enum_ == Error) goto LAB_00da9b2a;
    pEVar5 = (Expr *)operator_new(0x50);
    OVar2 = Token::opcode((Token *)auStack_90);
    (pEVar5->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar5->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    (pEVar5->loc).filename.data_ = (char *)CONCAT44(token.field_2._36_4_,token.field_2._32_4_);
    (pEVar5->loc).filename.size_ = CONCAT44(loc.filename.data_._4_4_,loc.filename.data_._0_4_);
    (pEVar5->loc).field_1.field_0.line = (int)loc.filename.size_;
    (pEVar5->loc).field_1.field_0.first_column = loc.filename.size_._4_4_;
    (pEVar5->loc).field_1.field_0.last_column = loc.field_1.field_0.line;
    *(int *)((long)&(pEVar5->loc).field_1 + 0xc) = loc.field_1.field_0.first_column;
    pEVar5->type_ = SimdShuffleOp;
    pEVar5->_vptr_Expr = (_func_int **)&PTR__Expr_013e2758;
    *(Enum *)&pEVar5->field_0x3c = OVar2.enum_;
    *(undefined4 *)&pEVar5[1]._vptr_Expr = local_1a8;
    *(undefined4 *)((long)&pEVar5[1]._vptr_Expr + 4) = uStack_1a4;
    *(undefined4 *)&pEVar5[1].super_intrusive_list_base<wabt::Expr>.next_ = uStack_1a0;
    *(undefined4 *)((long)&pEVar5[1].super_intrusive_list_base<wabt::Expr>.next_ + 4) = uStack_19c;
    goto LAB_00daa6f6;
  case Store:
    local_178 = CONCAT44(token.field_2._36_4_,token.field_2._32_4_);
    uStack_170 = CONCAT44(loc.filename.data_._4_4_,loc.filename.data_._0_4_);
    local_168 = CONCAT44(loc.filename.size_._4_4_,(int)loc.filename.size_);
    uStack_160 = CONCAT44(loc.field_1.field_0.first_column,loc.field_1.field_0.line);
    Consume(&local_400,this);
    loc_02.filename.size_ = uStack_170;
    loc_02.filename.data_ = (char *)local_178;
    loc_02.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)local_168;
    loc_02.field_1._8_8_ = uStack_160;
    RVar3 = ParsePlainLoadStoreInstr<wabt::LoadStoreExpr<(wabt::ExprType)39>>
                      (this,loc_02,&local_400,out_expr);
    pTVar7 = &local_400;
    goto LAB_00daa39f;
  case TeeLocal:
    Consume(&local_5e0,this);
    Token::~Token(&local_5e0);
    loc_01.filename.data_._4_4_ = token.field_2._36_4_;
    loc_01.filename.data_._0_4_ = token.field_2._32_4_;
    loc_01.filename.size_._4_4_ = loc.filename.data_._4_4_;
    loc_01.filename.size_._0_4_ = loc.filename.data_._0_4_;
    loc_01.field_1.field_0.first_column = loc.filename.size_._4_4_;
    loc_01.field_1.field_0.line = (int)loc.filename.size_;
    loc_01.field_1._12_4_ = loc.field_1.field_0.first_column;
    loc_01.field_1.field_0.last_column = loc.field_1.field_0.line;
    RVar3 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)43>>(this,loc_01,out_expr);
    break;
  case Ternary:
    Consume((Token *)auStack_90,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)auStack_90);
    pEVar5 = (Expr *)operator_new(0x40);
    OVar2 = Token::opcode((Token *)auStack_90);
    (pEVar5->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar5->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    *(undefined4 *)&(pEVar5->loc).filename.data_ = token.field_2._32_4_;
    *(undefined4 *)((long)&(pEVar5->loc).filename.data_ + 4) = token.field_2._36_4_;
    *(undefined4 *)&(pEVar5->loc).filename.size_ = loc.filename.data_._0_4_;
    *(undefined4 *)((long)&(pEVar5->loc).filename.size_ + 4) = loc.filename.data_._4_4_;
    (pEVar5->loc).field_1.field_0.line = (int)loc.filename.size_;
    (pEVar5->loc).field_1.field_0.first_column = loc.filename.size_._4_4_;
    (pEVar5->loc).field_1.field_0.last_column = loc.field_1.field_0.line;
    *(int *)((long)&(pEVar5->loc).field_1 + 0xc) = loc.field_1.field_0.first_column;
    pEVar5->type_ = Ternary;
    puVar6 = &OpcodeExpr<(wabt::ExprType)44>::vtable;
    goto LAB_00daa6eb;
  case Throw:
    Consume((Token *)auStack_90,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)auStack_90);
    Token::~Token((Token *)auStack_90);
    loc_21.filename.data_._4_4_ = token.field_2._36_4_;
    loc_21.filename.data_._0_4_ = token.field_2._32_4_;
    loc_21.filename.size_._4_4_ = loc.filename.data_._4_4_;
    loc_21.filename.size_._0_4_ = loc.filename.data_._0_4_;
    loc_21.field_1.field_0.first_column = loc.filename.size_._4_4_;
    loc_21.field_1.field_0.line = (int)loc.filename.size_;
    loc_21.field_1._12_4_ = loc.field_1.field_0.first_column;
    loc_21.field_1.field_0.last_column = loc.field_1.field_0.line;
    RVar3 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)45>>(this,loc_21,out_expr);
    break;
  case Unary:
    Consume((Token *)auStack_90,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)auStack_90);
    pEVar5 = (Expr *)operator_new(0x40);
    OVar2 = Token::opcode((Token *)auStack_90);
    (pEVar5->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar5->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    *(undefined4 *)&(pEVar5->loc).filename.data_ = token.field_2._32_4_;
    *(undefined4 *)((long)&(pEVar5->loc).filename.data_ + 4) = token.field_2._36_4_;
    *(undefined4 *)&(pEVar5->loc).filename.size_ = loc.filename.data_._0_4_;
    *(undefined4 *)((long)&(pEVar5->loc).filename.size_ + 4) = loc.filename.data_._4_4_;
    (pEVar5->loc).field_1.field_0.line = (int)loc.filename.size_;
    (pEVar5->loc).field_1.field_0.first_column = loc.filename.size_._4_4_;
    (pEVar5->loc).field_1.field_0.last_column = loc.field_1.field_0.line;
    *(int *)((long)&(pEVar5->loc).field_1 + 0xc) = loc.field_1.field_0.first_column;
    pEVar5->type_ = Unary;
    puVar6 = &OpcodeExpr<(wabt::ExprType)47>::vtable;
LAB_00daa6eb:
    pEVar5->_vptr_Expr = (_func_int **)(puVar6 + 0x10);
    *(Enum *)&pEVar5->field_0x3c = OVar2.enum_;
LAB_00daa6f6:
    pEVar9 = (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>.
             _M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
             super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl;
    (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
    super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
    super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl = pEVar5;
LAB_00daa6fc:
    if (pEVar9 != (Expr *)0x0) {
      (*pEVar9->_vptr_Expr[1])();
    }
    Token::~Token((Token *)auStack_90);
    goto LAB_00daa790;
  case Last_Opcode:
    Consume(&local_9a0,this);
    Token::~Token(&local_9a0);
    pEVar5 = (Expr *)operator_new(0x40);
    (pEVar5->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar5->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    (pEVar5->loc).filename.data_ = (char *)CONCAT44(token.field_2._36_4_,token.field_2._32_4_);
    (pEVar5->loc).filename.size_ = CONCAT44(loc.filename.data_._4_4_,loc.filename.data_._0_4_);
    (pEVar5->loc).field_1.field_1.offset =
         CONCAT44(loc.filename.size_._4_4_,(int)loc.filename.size_);
    *(ulong *)((long)&(pEVar5->loc).field_1 + 8) =
         CONCAT44(loc.field_1.field_0.first_column,loc.field_1.field_0.line);
    pEVar5->type_ = Last;
    puVar6 = &ExprMixin<(wabt::ExprType)48>::vtable;
LAB_00daa66d:
    pEVar5->_vptr_Expr = (_func_int **)(puVar6 + 0x10);
LAB_00daa674:
    auVar8 = (undefined1  [8])
             (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>.
             _M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
             super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl;
    (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
    super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
    super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl = pEVar5;
LAB_00daa67a:
    if (auVar8 != (undefined1  [8])0x0) {
      (*((Expr *)auVar8)->_vptr_Expr[1])();
    }
    goto LAB_00daa790;
  }
  if (RVar3.enum_ == Error) {
LAB_00daa75f:
    EVar4 = Error;
  }
  else {
LAB_00daa790:
    EVar4 = Ok;
  }
  return (Result)EVar4;
}

Assistant:

Result WastParser::ParsePlainInstr(std::unique_ptr<Expr>* out_expr) {
  WABT_TRACE(ParsePlainInstr);
  Location loc = GetLocation();
  switch (Peek()) {
    case TokenType::Unreachable:
      Consume();
      out_expr->reset(new UnreachableExpr(loc));
      break;

    case TokenType::Nop:
      Consume();
      out_expr->reset(new NopExpr(loc));
      break;

    case TokenType::Drop:
      Consume();
      out_expr->reset(new DropExpr(loc));
      break;

    case TokenType::Select:
      Consume();
      out_expr->reset(new SelectExpr(loc));
      break;

    case TokenType::Br:
      Consume();
      CHECK_RESULT(ParsePlainInstrVar<BrExpr>(loc, out_expr));
      break;

    case TokenType::BrIf:
      Consume();
      CHECK_RESULT(ParsePlainInstrVar<BrIfExpr>(loc, out_expr));
      break;

    case TokenType::BrTable: {
      Consume();
      auto expr = MakeUnique<BrTableExpr>(loc);
      CHECK_RESULT(ParseVarList(&expr->targets));
      expr->default_target = expr->targets.back();
      expr->targets.pop_back();
      *out_expr = std::move(expr);
      break;
    }

    case TokenType::Return:
      Consume();
      out_expr->reset(new ReturnExpr(loc));
      break;

    case TokenType::Call:
      Consume();
      CHECK_RESULT(ParsePlainInstrVar<CallExpr>(loc, out_expr));
      break;

    case TokenType::CallIndirect: {
      Consume();
      auto expr = MakeUnique<CallIndirectExpr>(loc);
      CHECK_RESULT(ParseTypeUseOpt(&expr->decl));
      CHECK_RESULT(ParseUnboundFuncSignature(&expr->decl.sig));
      *out_expr = std::move(expr);
      break;
    }

    case TokenType::ReturnCall:
      ErrorUnlessOpcodeEnabled(Consume());
      CHECK_RESULT(ParsePlainInstrVar<ReturnCallExpr>(loc, out_expr));
      break;

    case TokenType::ReturnCallIndirect: {
      ErrorUnlessOpcodeEnabled(Consume());
      auto expr = MakeUnique<ReturnCallIndirectExpr>(loc);
      CHECK_RESULT(ParseTypeUseOpt(&expr->decl));
      CHECK_RESULT(ParseUnboundFuncSignature(&expr->decl.sig));
      *out_expr = std::move(expr);
      break;
    }

    case TokenType::GetLocal:
      Consume();
      CHECK_RESULT(ParsePlainInstrVar<GetLocalExpr>(loc, out_expr));
      break;

    case TokenType::SetLocal:
      Consume();
      CHECK_RESULT(ParsePlainInstrVar<SetLocalExpr>(loc, out_expr));
      break;

    case TokenType::TeeLocal:
      Consume();
      CHECK_RESULT(ParsePlainInstrVar<TeeLocalExpr>(loc, out_expr));
      break;

    case TokenType::GetGlobal:
      Consume();
      CHECK_RESULT(ParsePlainInstrVar<GetGlobalExpr>(loc, out_expr));
      break;

    case TokenType::SetGlobal:
      Consume();
      CHECK_RESULT(ParsePlainInstrVar<SetGlobalExpr>(loc, out_expr));
      break;

    case TokenType::Load:
      CHECK_RESULT(
          ParsePlainLoadStoreInstr<LoadExpr>(loc, Consume(), out_expr));
      break;

    case TokenType::Store:
      CHECK_RESULT(
          ParsePlainLoadStoreInstr<StoreExpr>(loc, Consume(), out_expr));
      break;

    case TokenType::Const: {
      Const const_;
      CHECK_RESULT(ParseConst(&const_));
      out_expr->reset(new ConstExpr(const_, loc));
      break;
    }

    case TokenType::Unary: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      out_expr->reset(new UnaryExpr(token.opcode(), loc));
      break;
    }

    case TokenType::Binary:
      out_expr->reset(new BinaryExpr(Consume().opcode(), loc));
      break;

    case TokenType::Compare:
      out_expr->reset(new CompareExpr(Consume().opcode(), loc));
      break;

    case TokenType::Convert: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      out_expr->reset(new ConvertExpr(token.opcode(), loc));
      break;
    }

    case TokenType::MemoryCopy:
      ErrorUnlessOpcodeEnabled(Consume());
      out_expr->reset(new MemoryCopyExpr(loc));
      break;

    case TokenType::MemoryFill:
      ErrorUnlessOpcodeEnabled(Consume());
      out_expr->reset(new MemoryFillExpr(loc));
      break;

    case TokenType::MemoryDrop:
      ErrorUnlessOpcodeEnabled(Consume());
      CHECK_RESULT(ParsePlainInstrVar<MemoryDropExpr>(loc, out_expr));
      break;

    case TokenType::MemoryInit:
      ErrorUnlessOpcodeEnabled(Consume());
      CHECK_RESULT(ParsePlainInstrVar<MemoryInitExpr>(loc, out_expr));
      break;

    case TokenType::MemorySize:
      Consume();
      out_expr->reset(new MemorySizeExpr(loc));
      break;

    case TokenType::MemoryGrow:
      Consume();
      out_expr->reset(new MemoryGrowExpr(loc));
      break;

    case TokenType::TableCopy:
      ErrorUnlessOpcodeEnabled(Consume());
      out_expr->reset(new TableCopyExpr(loc));
      break;

    case TokenType::TableDrop:
      ErrorUnlessOpcodeEnabled(Consume());
      CHECK_RESULT(ParsePlainInstrVar<TableDropExpr>(loc, out_expr));
      break;

    case TokenType::TableInit:
      ErrorUnlessOpcodeEnabled(Consume());
      CHECK_RESULT(ParsePlainInstrVar<TableInitExpr>(loc, out_expr));
      break;

    case TokenType::Throw:
      ErrorUnlessOpcodeEnabled(Consume());
      CHECK_RESULT(ParsePlainInstrVar<ThrowExpr>(loc, out_expr));
      break;

    case TokenType::Rethrow:
      ErrorUnlessOpcodeEnabled(Consume());
      out_expr->reset(new RethrowExpr(loc));
      break;

    case TokenType::AtomicWake: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      CHECK_RESULT(
          ParsePlainLoadStoreInstr<AtomicWakeExpr>(loc, token, out_expr));
      break;
    }

    case TokenType::AtomicWait: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      CHECK_RESULT(
          ParsePlainLoadStoreInstr<AtomicWaitExpr>(loc, token, out_expr));
      break;
    }

    case TokenType::AtomicLoad: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      CHECK_RESULT(
          ParsePlainLoadStoreInstr<AtomicLoadExpr>(loc, token, out_expr));
      break;
    }

    case TokenType::AtomicStore: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      CHECK_RESULT(
          ParsePlainLoadStoreInstr<AtomicStoreExpr>(loc, token, out_expr));
      break;
    }

    case TokenType::AtomicRmw: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      CHECK_RESULT(
          ParsePlainLoadStoreInstr<AtomicRmwExpr>(loc, token, out_expr));
      break;
    }

    case TokenType::AtomicRmwCmpxchg: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      CHECK_RESULT(
          ParsePlainLoadStoreInstr<AtomicRmwCmpxchgExpr>(loc, token, out_expr));
      break;
    }

    case TokenType::Ternary: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      out_expr->reset(new TernaryExpr(token.opcode(), loc));
      break;
    }

    case TokenType::SimdLaneOp: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      uint64_t lane_idx;
      CHECK_RESULT(ParseNat(&lane_idx));
      out_expr->reset(new SimdLaneOpExpr(token.opcode(), lane_idx, loc));
      break;
    }

    case TokenType::SimdShuffleOp: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      Const const_;
      CHECK_RESULT((ParseSimdConst(&const_, Type::I32, sizeof(v128))));
      out_expr->reset(
          new SimdShuffleOpExpr(token.opcode(), const_.v128_bits, loc));
      break;
    }

    default:
      assert(
          !"ParsePlainInstr should only be called when IsPlainInstr() is true");
      return Result::Error;
  }

  return Result::Ok;
}